

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtxParam_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int value)

{
  int iVar1;
  int local_24;
  ZSTD_dictAttachPref_e pref;
  int cLevel;
  int value_local;
  ZSTD_cParameter param_local;
  ZSTD_CCtx_params *CCtxParams_local;
  
  if (param == ZSTD_c_experimentalParam2) {
    iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam2,value);
    if (iVar1 == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
    else {
      CCtxParams->format = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)CCtxParams->format;
    }
  }
  else if (param == ZSTD_c_compressionLevel) {
    iVar1 = ZSTD_maxCLevel();
    local_24 = value;
    if (iVar1 < value) {
      local_24 = ZSTD_maxCLevel();
    }
    iVar1 = ZSTD_minCLevel();
    if (local_24 < iVar1) {
      local_24 = ZSTD_minCLevel();
    }
    if (local_24 != 0) {
      CCtxParams->compressionLevel = local_24;
    }
    if (CCtxParams->compressionLevel < 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0x0;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)(long)CCtxParams->compressionLevel;
    }
  }
  else if (param == ZSTD_c_windowLog) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_windowLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).windowLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->cParams).windowLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_hashLog) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_hashLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).hashLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->cParams).hashLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_chainLog) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_chainLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).chainLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->cParams).chainLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_searchLog) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_searchLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).searchLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(long)value;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_minMatch) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_minMatch,value), iVar1 != 0)) {
      (CCtxParams->cParams).minMatch = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->cParams).minMatch;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_targetLength) {
    iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_targetLength,value);
    if (iVar1 == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
    else {
      (CCtxParams->cParams).targetLength = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->cParams).targetLength;
    }
  }
  else if (param == ZSTD_c_strategy) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_strategy,value), iVar1 != 0)) {
      (CCtxParams->cParams).strategy = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->cParams).strategy;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_enableLongDistanceMatching) {
    (CCtxParams->ldmParams).enableLdm = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->ldmParams).enableLdm;
  }
  else if (param == ZSTD_c_ldmHashLog) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmHashLog,value), iVar1 != 0)) {
      (CCtxParams->ldmParams).hashLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->ldmParams).hashLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_ldmMinMatch) {
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmMinMatch,value), iVar1 != 0)) {
      (CCtxParams->ldmParams).minMatchLength = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->ldmParams).minMatchLength;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_ldmBucketSizeLog) {
    if ((value == 0) ||
       (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmBucketSizeLog,value), iVar1 != 0)) {
      (CCtxParams->ldmParams).bucketSizeLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->ldmParams).bucketSizeLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_ldmHashRateLog) {
    if (value < 0x1a) {
      (CCtxParams->ldmParams).hashRateLog = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)(CCtxParams->ldmParams).hashRateLog;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
  }
  else if (param == ZSTD_c_contentSizeFlag) {
    (CCtxParams->fParams).contentSizeFlag = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(long)(CCtxParams->fParams).contentSizeFlag;
  }
  else if (param == ZSTD_c_checksumFlag) {
    (CCtxParams->fParams).checksumFlag = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(long)(CCtxParams->fParams).checksumFlag;
  }
  else if (param == ZSTD_c_dictIDFlag) {
    (CCtxParams->fParams).noDictIDFlag = (uint)((value != 0 ^ 0xffU) & 1);
    CCtxParams_local =
         (ZSTD_CCtx_params *)
         (long)(int)(uint)(((CCtxParams->fParams).noDictIDFlag != 0 ^ 0xffU) & 1);
  }
  else if (param == ZSTD_c_nbWorkers) {
    if (value == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0x0;
    }
    else {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd8;
    }
  }
  else if (param == ZSTD_c_jobSize) {
    CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd8;
  }
  else if (param == ZSTD_c_overlapLog) {
    CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd8;
  }
  else if (param == ZSTD_c_experimentalParam1) {
    CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd8;
  }
  else if (param == ZSTD_c_experimentalParam3) {
    CCtxParams->forceWindow = (uint)(value != 0);
    CCtxParams_local = (ZSTD_CCtx_params *)(long)CCtxParams->forceWindow;
  }
  else if (param == ZSTD_c_experimentalParam4) {
    iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam4,value);
    if (iVar1 == 0) {
      CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd6;
    }
    else {
      CCtxParams->attachDictPref = value;
      CCtxParams_local = (ZSTD_CCtx_params *)(ulong)CCtxParams->attachDictPref;
    }
  }
  else {
    CCtxParams_local = (ZSTD_CCtx_params *)0xffffffffffffffd8;
  }
  return (size_t)CCtxParams_local;
}

Assistant:

size_t ZSTD_CCtxParam_setParameter(ZSTD_CCtx_params* CCtxParams,
                                   ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtxParam_setParameter (%i, %i)", (int)param, value);
    switch(param)
    {
    case ZSTD_c_format :
        BOUNDCHECK(ZSTD_c_format, value);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_c_compressionLevel : {
        int cLevel = value;
        if (cLevel > ZSTD_maxCLevel()) cLevel = ZSTD_maxCLevel();
        if (cLevel < ZSTD_minCLevel()) cLevel = ZSTD_minCLevel();
        if (cLevel) {  /* 0 : does not change current level */
            CCtxParams->compressionLevel = cLevel;
        }
        if (CCtxParams->compressionLevel >= 0) return CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_c_windowLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_windowLog, value);
        CCtxParams->cParams.windowLog = value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_c_hashLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_hashLog, value);
        CCtxParams->cParams.hashLog = value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_c_chainLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_chainLog, value);
        CCtxParams->cParams.chainLog = value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_c_searchLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_searchLog, value);
        CCtxParams->cParams.searchLog = value;
        return value;

    case ZSTD_c_minMatch :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_minMatch, value);
        CCtxParams->cParams.minMatch = value;
        return CCtxParams->cParams.minMatch;

    case ZSTD_c_targetLength :
        BOUNDCHECK(ZSTD_c_targetLength, value);
        CCtxParams->cParams.targetLength = value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_c_strategy :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_strategy, value);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_c_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value!=0));
        CCtxParams->fParams.contentSizeFlag = value != 0;
        return CCtxParams->fParams.contentSizeFlag;

    case ZSTD_c_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value != 0;
        return CCtxParams->fParams.checksumFlag;

    case ZSTD_c_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value!=0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_c_forceMaxWindow :
        CCtxParams->forceWindow = (value != 0);
        return CCtxParams->forceWindow;

    case ZSTD_c_forceAttachDict : {
        const ZSTD_dictAttachPref_e pref = (ZSTD_dictAttachPref_e)value;
        BOUNDCHECK(ZSTD_c_forceAttachDict, pref);
        CCtxParams->attachDictPref = pref;
        return CCtxParams->attachDictPref;
    }

    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        if (value!=0) return ERROR(parameter_unsupported);
        return 0;
#else
        return ZSTDMT_CCtxParam_setNbWorkers(CCtxParams, value);
#endif

    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_jobSize, value);
#endif

    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_overlapLog, value);
#endif

    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_rsyncable, value);
#endif

    case ZSTD_c_enableLongDistanceMatching :
        CCtxParams->ldmParams.enableLdm = (value!=0);
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_c_ldmHashLog :
        if (value!=0)   /* 0 ==> auto */
            BOUNDCHECK(ZSTD_c_ldmHashLog, value);
        CCtxParams->ldmParams.hashLog = value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_c_ldmMinMatch :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmMinMatch, value);
        CCtxParams->ldmParams.minMatchLength = value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_c_ldmBucketSizeLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmBucketSizeLog, value);
        CCtxParams->ldmParams.bucketSizeLog = value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_c_ldmHashRateLog :
        if (value > ZSTD_WINDOWLOG_MAX - ZSTD_HASHLOG_MIN)
            return ERROR(parameter_outOfBound);
        CCtxParams->ldmParams.hashRateLog = value;
        return CCtxParams->ldmParams.hashRateLog;

    default: return ERROR(parameter_unsupported);
    }
}